

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeDisc.cpp
# Opt level: O2

void pzshape::TPZShapeDisc::PolynomialWithoutScale
               (REAL C,REAL x0,REAL x,int degree,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi,
               int n)

{
  long row;
  long row_00;
  double dVar1;
  double dVar2;
  double *pdVar3;
  long row_01;
  long lVar4;
  
  if (degree < 0) {
    std::operator<<((ostream *)&std::cerr,
                    "TPZShapeDisc::Polynomial the degree of the polynomial cannot be minus, aborting\n"
                   );
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeDisc.cpp"
               ,0x89);
  }
  (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (phi,(long)(degree + 1),1);
  (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (dphi,(long)n,(long)(degree + 1));
  pdVar3 = TPZFMatrix<double>::operator()(phi,0,0);
  *pdVar3 = 1.0;
  if (degree != 0) {
    pdVar3 = TPZFMatrix<double>::operator()(phi,1,0);
    *pdVar3 = x;
    pdVar3 = TPZFMatrix<double>::operator()(dphi,0,1);
    *pdVar3 = 1.0;
    for (row_01 = 2; row_01 <= degree; row_01 = row_01 + 1) {
      row_00 = row_01 + -1;
      pdVar3 = TPZFMatrix<double>::operator()(phi,row_00,0);
      dVar1 = *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()(phi,row_01,0);
      *pdVar3 = dVar1 * x;
      pdVar3 = TPZFMatrix<double>::operator()(dphi,0,row_00);
      dVar1 = *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()(phi,row_00,0);
      dVar2 = *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()(dphi,0,row_01);
      *pdVar3 = dVar1 * x + dVar2;
      for (lVar4 = 2; lVar4 <= n; lVar4 = lVar4 + 1) {
        row = lVar4 + -1;
        pdVar3 = TPZFMatrix<double>::operator()(dphi,row,row_00);
        dVar1 = *pdVar3;
        pdVar3 = TPZFMatrix<double>::operator()(dphi,lVar4 + -2,row_00);
        dVar2 = *pdVar3;
        pdVar3 = TPZFMatrix<double>::operator()(dphi,row,row_01);
        *pdVar3 = (double)((int)row + 1) * dVar2 + dVar1 * x;
      }
    }
  }
  return;
}

Assistant:

void TPZShapeDisc::PolynomialWithoutScale(REAL C,REAL x0,REAL x,int degree,TPZFMatrix<REAL> & phi,TPZFMatrix<REAL> & dphi, int n){
#ifdef PZDEBUG
  if(IsZero(C)){
    DebugStop();
  }
#endif
   if(degree < 0){
      PZError << "TPZShapeDisc::Polynomial the degree of the polynomial cannot be minus, aborting\n";
      DebugStop();
   }
   phi.Redim(degree+1,1);
   dphi.Redim(n,degree+1);
   //grau zero ou constante
   phi(0,0) = 1.0;
   if(degree == 0) return;
   //grau 1
   REAL val = x;
   phi(1,0) = val;
   dphi(0,1) = 1.; 
   //grau maior que 1
   int p;
   degree++;
   for(p = 2;p < degree; p++) {
      phi(p,0) = phi(p-1,0)*val;
      int ideriv;
      dphi(0,p) = dphi(0,p-1)*val + phi(p-1,0)* 1.0;
      for(ideriv=2; ideriv<=n; ideriv++) {
	 dphi(ideriv-1,p) = val*dphi(ideriv-1,p-1)+(ideriv)*dphi(ideriv-2,p-1);
      }
   }         
}